

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O0

CRef __thiscall
Minisat::ClauseAllocator::alloc(ClauseAllocator *this,vec<Minisat::Lit,_int> *ps,bool learnt)

{
  Size size;
  uint32_t size_00;
  Ref r;
  Clause *this_00;
  bool has_extra;
  CRef cid;
  bool use_extra;
  bool learnt_local;
  vec<Minisat::Lit,_int> *ps_local;
  ClauseAllocator *this_local;
  
  has_extra = learnt || (this->extra_clause_field & 1U) != 0;
  size = vec<Minisat::Lit,_int>::size(ps);
  size_00 = clauseWord32Size(size,has_extra);
  r = RegionAllocator<unsigned_int>::alloc(&this->ra,size_00);
  this_00 = lea(this,r);
  Clause::Clause(this_00,ps,has_extra,learnt);
  return r;
}

Assistant:

CRef alloc(const vec<Lit>& ps, bool learnt = false)
    {
        assert(sizeof(Lit)      == sizeof(uint32_t));
        assert(sizeof(float)    == sizeof(uint32_t));
        bool use_extra = learnt | extra_clause_field;
        CRef cid       = ra.alloc(clauseWord32Size(ps.size(), use_extra));
        new (lea(cid)) Clause(ps, use_extra, learnt);

        return cid;
    }